

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O0

void __thiscall
TPZMatRed<double,_TPZFMatrix<double>_>::F1Red
          (TPZMatRed<double,_TPZFMatrix<double>_> *this,TPZFMatrix<double> *F1Red)

{
  int64_t iVar1;
  int64_t iVar2;
  TPZMatrixSolver<double> *pTVar3;
  TPZFMatrix<double> *in_RSI;
  TPZFMatrix<double> *in_RDI;
  int in_stack_000000e4;
  double in_stack_000000e8;
  double in_stack_000000f0;
  TPZFMatrix<double> *in_stack_000000f8;
  TPZFMatrix<double> *in_stack_00000100;
  TPZFMatrix<double> *in_stack_00000108;
  TPZFMatrix<double> *in_stack_00000110;
  TPZMatRed<double,_TPZFMatrix<double>_> *in_stack_00000120;
  
  if (in_RDI[5].fSize == 0) {
    TPZFMatrix<double>::operator=(in_RDI,in_RSI);
  }
  else {
    iVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)&in_RDI->fSize);
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)&in_RDI[3].fSize);
    (*(in_RSI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
              (in_RSI,iVar1,iVar2);
    if (((ulong)in_RDI[5].fPivot.super_TPZVec<int>.fStore & 0x10000) == 0) {
      DecomposeK00(in_stack_00000120);
      pTVar3 = TPZAutoPointer<TPZMatrixSolver<double>_>::operator->
                         ((TPZAutoPointer<TPZMatrixSolver<double>_> *)&in_RDI->fGiven);
      (*(pTVar3->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])
                (pTVar3,&in_RDI[3].fSize,&in_RDI[3].fSize,0);
      *(undefined1 *)((long)&in_RDI[5].fPivot.super_TPZVec<int>.fStore + 2) = 1;
    }
    TPZFMatrix<double>::MultAdd
              (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
               in_stack_000000f0,in_stack_000000e8,in_stack_000000e4);
  }
  return;
}

Assistant:

void TPZMatRed<TVar, TSideMatrix>::F1Red(TPZFMatrix<TVar> &F1Red)
{
	if (!fDim0)
    {
        F1Red = fF1;
        return;
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "fF0 input " << std::endl;
        fF0.Print("fF0",sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    F1Red.Resize(fK11.Rows(),fF0.Cols());
    if (!fF0IsComputed)
    {
        DecomposeK00();
        fSolver->Solve(fF0,fF0);
        fF0IsComputed = true;
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "After computing F0Invert" << std::endl;
        fF0.Print("F0Invert",sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
	
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Input fF1" << std::endl;
        fF1.Print("fF1",sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
	//make [F1]=[F1]-[K10][F0Invert]
	fK10.MultAdd((fF0),fF1,(F1Red),-1,1);
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        F1Red.Print("F1 Reduced", sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
	return;
}